

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O0

int bios_string(envy_bios *bios,uint offs,char *res,int len)

{
  int local_30;
  int i;
  int len_local;
  char *res_local;
  uint offs_local;
  envy_bios *bios_local;
  
  if ((offs + len) - 1 < bios->length) {
    for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
      res[local_30] = bios->data[offs + local_30];
    }
    res[len] = '\0';
    bios_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"requested OOB string at 0x%04x len 0x%04x\n",(ulong)offs,(ulong)(uint)len);
    bios_local._4_4_ = -0xe;
  }
  return bios_local._4_4_;
}

Assistant:

static inline int bios_string(struct envy_bios *bios, unsigned int offs, char *res, int len) {
	if (offs+len-1 >= bios->length) {
		ENVY_BIOS_ERR("requested OOB string at 0x%04x len 0x%04x\n", offs, len);
		return -EFAULT;
	}
	int i;
	for (i = 0; i < len; i++)
		res[i] = bios->data[offs+i];
	res[len] = 0;
	return 0;
}